

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

Duration * __thiscall absl::lts_20250127::Duration::operator/=(Duration *this,int64_t r)

{
  uint uVar1;
  uint uVar2;
  HiRep HVar4;
  ulong uVar6;
  uint32_t uVar7;
  undefined1 auVar8 [16];
  ulong uVar3;
  ulong uVar5;
  
  HVar4 = this->rep_hi_;
  uVar1 = this->rep_lo_;
  if (r == 0 || uVar1 == 0xffffffff) {
    HVar4 = (HiRep)((ulong)((long)((ulong)HVar4 ^ r) < 0) + 0x7fffffffffffffff);
    uVar7 = 0xffffffff;
  }
  else {
    uVar2 = 4000000000 - uVar1;
    if (-1 < (long)HVar4) {
      uVar2 = uVar1;
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)HVar4 >> 0x3f ^ (ulong)HVar4;
    auVar8 = auVar8 * ZEXT816(4000000000) + ZEXT416(uVar2);
    auVar8 = __udivti3(auVar8._0_8_,auVar8._8_8_,(r >> 0x3f ^ r) - (r >> 0x3f),0);
    uVar5 = auVar8._8_8_;
    uVar3 = auVar8._0_8_;
    uVar6 = (ulong)HVar4 ^ r;
    if (uVar5 == 0) {
      HVar4 = (HiRep)(uVar3 / 4000000000);
    }
    else {
      if (1999999999 < uVar5) {
        HVar4.lo_ = 0;
        HVar4.hi_ = 0x80000000;
        if (-1 < (long)uVar6) {
          HVar4.lo_ = 0xffffffff;
          HVar4.hi_ = 0x7fffffff;
        }
        uVar7 = -(uint)(-1 < (long)uVar6 || (uVar3 != 0 || uVar5 != 2000000000));
        goto LAB_004ab17f;
      }
      HVar4 = (HiRep)__udivti3(uVar3,uVar5,4000000000,0);
    }
    uVar7 = auVar8._0_4_ + HVar4.lo_ * 0x1194d800;
    if ((long)uVar6 < 0) {
      if (uVar7 == 0) {
        HVar4 = (HiRep)-(long)HVar4;
        uVar7 = 0;
      }
      else {
        HVar4 = (HiRep)~(ulong)HVar4;
        uVar7 = 4000000000 - uVar7;
      }
    }
  }
LAB_004ab17f:
  this->rep_hi_ = HVar4;
  this->rep_lo_ = uVar7;
  return this;
}

Assistant:

Duration& Duration::operator/=(int64_t r) {
  if (time_internal::IsInfiniteDuration(*this) || r == 0) {
    const bool is_neg = (r < 0) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleFixed<std::divides>(*this, r);
}